

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.cpp
# Opt level: O0

bool __thiscall FIX::FileStore::get(FileStore *this,SEQNUM msgSeqNum,string *msg)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  IOException *pIVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  unsigned_long local_80;
  size_t result;
  char *buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  pair<long,_unsigned_long> *local_40;
  OffsetSize *offset;
  _Self local_30;
  const_iterator find;
  string *msg_local;
  SEQNUM msgSeqNum_local;
  FileStore *this_local;
  
  find._M_node = (_Base_ptr)msg;
  msg_local = (string *)msgSeqNum;
  msgSeqNum_local = (SEQNUM)this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::pair<long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>_>
       ::find(&this->m_offsets,(key_type_conflict *)&msg_local);
  offset = (OffsetSize *)
           std::
           map<unsigned_long,_std::pair<long,_unsigned_long>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>_>
           ::end(&this->m_offsets);
  bVar1 = std::operator==(&local_30,(_Self *)&offset);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::pair<long,_unsigned_long>_>_>
             ::operator->(&local_30);
    local_40 = &ppVar3->second;
    iVar2 = fseek((FILE *)this->m_msgFile,local_40->first,0);
    if (iVar2 != 0) {
      buffer._3_1_ = 1;
      pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
      std::operator+(&local_60,"Unable to seek in file ",&this->m_msgFileName);
      IOException::IOException(pIVar4,&local_60);
      buffer._3_1_ = 0;
      __cxa_throw(pIVar4,&IOException::typeinfo,IOException::~IOException);
    }
    result = (size_t)operator_new__(local_40->second + 1);
    local_80 = fread((void *)result,1,local_40->second,(FILE *)this->m_msgFile);
    iVar2 = ferror((FILE *)this->m_msgFile);
    if ((iVar2 != 0) || (local_80 != local_40->second)) {
      if (result != 0) {
        operator_delete__((void *)result);
      }
      pIVar4 = (IOException *)__cxa_allocate_exception(0x50);
      std::operator+(&local_a0,"Unable to read from file ",&this->m_msgFileName);
      IOException::IOException(pIVar4,&local_a0);
      __cxa_throw(pIVar4,&IOException::typeinfo,IOException::~IOException);
    }
    *(undefined1 *)(result + local_40->second) = 0;
    std::__cxx11::string::operator=((string *)find._M_node,(char *)result);
    if (result != 0) {
      operator_delete__((void *)result);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

EXCEPT(IOException) {
  NumToOffset::const_iterator find = m_offsets.find(msgSeqNum);
  if (find == m_offsets.end()) {
    return false;
  }
  const OffsetSize &offset = find->second;
  if (fseek(m_msgFile, offset.first, SEEK_SET)) {
    throw IOException("Unable to seek in file " + m_msgFileName);
  }
  char *buffer = new char[offset.second + 1];
  size_t result = fread(buffer, sizeof(char), offset.second, m_msgFile);
  if (ferror(m_msgFile) || result != (size_t)offset.second) {
    delete[] buffer;
    throw IOException("Unable to read from file " + m_msgFileName);
  }
  buffer[offset.second] = 0;
  msg = buffer;
  delete[] buffer;
  return true;
}